

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzhamtest.cpp
# Opt level: O1

int main_internal(string_array *cmd_line,int num_helper_threads,ilzham *lzham_dll)

{
  comp_options options_00;
  comp_options options_01;
  comp_options options_02;
  bool bVar1;
  bool bVar2;
  int iVar3;
  lzham_compress_level lVar4;
  lzham_compress_status_t lVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  timer_ticks tVar9;
  FILE *pFVar10;
  __off64_t _Var11;
  __off64_t _Var12;
  timer_ticks tVar13;
  undefined1 recursive;
  uint *in_RCX;
  string_array *files;
  allocator<char> *paVar14;
  undefined2 **ppuVar15;
  int iVar16;
  uint uVar17;
  undefined8 uVar18;
  pointer pcVar19;
  char *pMsg;
  char *pcVar20;
  ulong uVar21;
  long lVar22;
  pointer pbVar23;
  _Alloc_hider _Var24;
  bool bVar25;
  double dVar26;
  comp_options options;
  size_t cmp_len;
  lzham_uint32 comp_adler32;
  lzham_decompress_params decomp_params;
  size_t decomp_size;
  lzham_uint8 cmp_buf [1024];
  lzham_uint8 decomp_buf [1024];
  comp_options local_8f8;
  ulong local_8e0;
  comp_options local_8d8;
  ilzham *local_8c0;
  long local_8b8;
  long local_8b0;
  undefined4 local_8a4;
  lzham_uint32 local_8a0;
  lzham_uint32 local_89c;
  string local_898;
  size_t local_878;
  undefined7 uStack_870;
  undefined1 uStack_869;
  undefined3 uStack_868;
  timer_ticks local_860;
  string local_858;
  undefined2 *local_838;
  undefined8 local_830;
  undefined2 local_828;
  undefined6 uStack_826;
  allocator<char> local_438 [1032];
  
  recursive = SUB81(in_RCX,0);
  local_8f8.m_comp_level = LZHAM_COMP_LEVEL_UBER;
  local_8f8.m_dict_size_log2 = 0x1c;
  local_8f8.m_compute_adler32_during_decomp = true;
  local_8f8.m_unbuffered_decompression = false;
  local_8f8.m_verify_compressed_data = false;
  local_8f8.m_force_polar_codes = false;
  local_8f8.m_randomize_params = false;
  local_8f8.m_extreme_parsing = false;
  local_8f8.m_deterministic_parsing = false;
  local_8f8.m_max_helper_threads = num_helper_threads;
  if ((cmd_line->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (cmd_line->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    print_usage();
    putchar(10);
    puts("LZHAM simple memory to memory compression test");
    local_858.field_2._M_allocated_capacity._0_4_ = 0;
    local_858.field_2._M_allocated_capacity._4_4_ = 0;
    local_858.field_2._8_4_ = 0;
    local_858._M_dataplus._M_p._0_4_ = 0x1c;
    local_858._M_string_length._0_4_ = local_8f8.m_comp_level;
    local_858._M_dataplus._M_p._4_4_ = local_8f8.m_dict_size_log2;
    local_858._M_string_length._4_4_ = 1;
    local_8d8.m_comp_level = 0x400;
    local_8d8.m_dict_size_log2 = 0;
    local_89c = 0;
    lVar5 = (*lzham_dll->lzham_compress_memory)
                      ((lzham_compress_params *)&local_858,(lzham_uint8 *)&local_838,
                       (size_t *)&local_8d8,
                       (lzham_uint8 *)
                       "This is a test.This is a test.This is a test.1234567This is a test.This is a test.123456"
                       ,0x58,&local_89c);
    if (lVar5 == LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE) {
      printf("Uncompressed size: %u\nCompressed size: %u\n",0x58,local_8d8._0_8_ & 0xffffffff);
      local_898._M_dataplus._M_p._4_4_ = local_8f8.m_dict_size_log2;
      local_898._M_dataplus._M_p._0_4_ = 0x10;
      local_898._M_string_length._0_4_ = 0;
      local_898._M_string_length._4_4_ = local_8f8._8_4_ & 0xff;
      local_878 = 0x400;
      local_8a0 = 0;
      lVar5 = (*lzham_dll->lzham_decompress_memory)
                        ((lzham_decompress_params *)&local_898,(lzham_uint8 *)local_438,&local_878,
                         (lzham_uint8 *)&local_838,local_8d8._0_8_,&local_8a0);
      if (lVar5 == LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE) {
        if (((local_89c == local_8a0) && (local_878 == 0x58)) &&
           (iVar7 = bcmp(local_438,
                         "This is a test.This is a test.This is a test.1234567This is a test.This is a test.123456"
                         ,0x58), iVar7 == 0)) {
          puts("Compression test succeeded.");
          return 0;
        }
        print_error("Compression test failed!\n");
        return 1;
      }
    }
    print_error("Compression test failed with status %i!\n",(ulong)lVar5);
    return 1;
  }
  pbVar23 = (cmd_line->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_8c0 = lzham_dll;
  if ((int)((ulong)((long)(cmd_line->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar23) >> 5) < 1) {
    bVar25 = true;
    iVar7 = -1;
  }
  else {
    iVar7 = -1;
    iVar16 = 0;
    do {
      pcVar20 = pbVar23[iVar16]._M_dataplus._M_p;
      if (*pcVar20 == 0x2d) {
        if (pbVar23[iVar16]._M_string_length < 2) {
switchD_001076b2_caseD_66:
          pMsg = "Invalid option: %s\n";
          goto LAB_0010782c;
        }
        iVar3 = tolower((int)pcVar20[1]);
        in_RCX = &switchD_001076b2::switchdataD_00121050;
        uVar17 = local_8f8.m_max_helper_threads;
        switch(iVar3) {
        case 99:
          local_8f8._8_4_ = local_8f8._8_4_ & 0xffffff00;
          break;
        case 100:
          iVar3 = atoi(pcVar20 + 2);
          if (iVar3 - 0xfU < 0xf) {
            local_8f8.m_dict_size_log2 = iVar3;
            uVar17 = local_8f8.m_max_helper_threads;
            break;
          }
          print_error("Invalid dictionary size: %s\n",pcVar20);
          iVar3 = 1;
          goto LAB_001077f6;
        case 0x65:
          local_8f8.m_deterministic_parsing = true;
          break;
        default:
          goto switchD_001076b2_caseD_66;
        case 0x6d:
          lVar4 = atoi(pcVar20 + 2);
          if (LZHAM_COMP_LEVEL_UBER < lVar4) {
            print_error("Invalid compression level: %s\n",pcVar20);
            iVar3 = 1;
            goto LAB_001077f6;
          }
          local_8f8.m_comp_level = lVar4;
          uVar17 = local_8f8.m_max_helper_threads;
          break;
        case 0x70:
          local_8f8.m_force_polar_codes = true;
          break;
        case 0x72:
          local_8f8.m_randomize_params = true;
          break;
        case 0x73:
          uVar17 = atoi(pcVar20 + 2);
          srand(uVar17);
          printf("Using random seed: %i\n",(ulong)uVar17);
          uVar17 = local_8f8.m_max_helper_threads;
          break;
        case 0x74:
          uVar17 = atoi(pcVar20 + 2);
          if (0x10 < uVar17) {
            print_error("Invalid number of helper threads: %s\n",pcVar20);
            iVar3 = 1;
            goto LAB_001077f6;
          }
          break;
        case 0x75:
          local_8f8.m_unbuffered_decompression = true;
          break;
        case 0x76:
          local_8f8.m_verify_compressed_data = true;
          break;
        case 0x78:
          local_8f8.m_extreme_parsing = true;
        }
        local_8f8.m_max_helper_threads = uVar17;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase(cmd_line,(cmd_line->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + iVar16);
        iVar16 = iVar16 + -1;
        iVar3 = 4;
      }
      else {
        if (pbVar23[iVar16]._M_string_length == 1) {
          iVar3 = tolower((int)*pcVar20);
          if (iVar3 == 0x61) {
            iVar7 = 2;
          }
          else {
            local_8e0 = CONCAT44(local_8e0._4_4_,iVar7);
            iVar7 = 0;
            if (iVar3 != 99) {
              if (iVar3 != 100) {
                print_error("Invalid mode: %s\n",pcVar20);
                iVar3 = 1;
                iVar7 = (int)local_8e0;
                goto LAB_001077f6;
              }
              iVar7 = 1;
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_erase(cmd_line,pbVar23 + iVar16);
          iVar3 = 2;
          goto LAB_001077f6;
        }
        pMsg = "Invalid mode: %s\n";
LAB_0010782c:
        print_error(pMsg,pcVar20);
        iVar3 = 1;
      }
LAB_001077f6:
      recursive = SUB81(in_RCX,0);
      if (iVar3 != 4) goto LAB_00107a04;
      iVar16 = iVar16 + 1;
      pbVar23 = (cmd_line->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (iVar16 < (int)((ulong)((long)(cmd_line->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)pbVar23) >> 5));
    iVar3 = 2;
LAB_00107a04:
    bVar25 = iVar3 == 2;
  }
  if (!bVar25) {
    return 1;
  }
  if (iVar7 == -1) {
    print_error("No mode specified!\n");
    print_usage();
    return 1;
  }
  puts("Using options:");
  comp_options::print(&local_8f8);
  putchar(10);
  bVar25 = local_8f8.m_randomize_params;
  pbVar23 = (cmd_line->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar8 = (long)(cmd_line->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar23;
  if (iVar7 == 2) {
    if ((long)uVar8 >> 5 == 1) {
      pcVar20 = (pbVar23->_M_dataplus)._M_p;
      local_878._0_4_ = local_8f8.m_comp_level;
      local_878._4_4_ = local_8f8.m_dict_size_log2;
      uStack_870 = (undefined7)CONCAT44(local_8f8.m_max_helper_threads,local_8f8._8_4_);
      uStack_869 = (undefined1)((uint)local_8f8.m_max_helper_threads >> 0x18);
      _uStack_869 = CONCAT31(CONCAT12(local_8f8.m_force_polar_codes,
                                      CONCAT11(local_8f8.m_verify_compressed_data,
                                               local_8f8.m_unbuffered_decompression)),uStack_869);
      local_8a4 = CONCAT22(local_8f8._22_2_,
                           CONCAT11(local_8f8.m_deterministic_parsing,local_8f8.m_extreme_parsing));
      local_898._0_16_ = (lzham_decompress_params)0x0;
      local_898.field_2._M_allocated_capacity = 0;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_858,pcVar20,local_438);
      local_828 = 0x2a;
      local_830 = 1;
      local_838 = &local_828;
      bVar1 = find_files(&local_858,&local_898,files,(bool)recursive);
      if (local_838 != &local_828) {
        operator_delete(local_838,CONCAT62(uStack_826,local_828) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_858._M_dataplus._M_p._4_4_,local_858._M_dataplus._M_p._0_4_) !=
          &local_858.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_858._M_dataplus._M_p._4_4_,local_858._M_dataplus._M_p._0_4_),
                        CONCAT44(local_858.field_2._M_allocated_capacity._4_4_,
                                 local_858.field_2._M_allocated_capacity._0_4_) + 1);
      }
      if (bVar1) {
        tVar13 = timer::get_ticks();
        tVar9 = timer::get_init_ticks();
        local_860 = tVar13;
        sprintf((char *)&local_838,"__comp_temp_%u__.tmp",tVar9 & 0xffffffff);
        sprintf((char *)local_438,"__decomp_temp_%u__.tmp",tVar9 & 0xffffffff);
        bVar1 = local_898._M_string_length - (long)local_898._M_dataplus._M_p == 0;
        if (bVar1) {
          local_8e0 = 0;
          local_8b0 = 0;
          local_8b8 = 0;
        }
        else {
          uVar8 = (long)(local_898._M_string_length - (long)local_898._M_dataplus._M_p) >> 5;
          uVar17 = 1;
          bVar1 = false;
          uVar21 = 0;
          local_8e0 = 0;
          local_8b8 = 0;
          local_8b0 = 0;
          _Var24._M_p = local_898._M_dataplus._M_p;
          do {
            lVar22 = uVar21 * 0x20;
            pcVar19 = _Var24._M_p + lVar22;
            printf("***** [%u of %u] Compressing file \"%s\" to \"%s\"\n",(ulong)uVar17,uVar8,
                   *(undefined8 *)(_Var24._M_p + lVar22),(allocator<char> *)&local_838);
            pFVar10 = fopen64(*(char **)(_Var24._M_p + lVar22),"rb");
            if (pFVar10 == (FILE *)0x0) {
              printf("Skipping unreadable file \"%s\"\n",*(undefined8 *)pcVar19);
              bVar2 = false;
            }
            else {
              fseek(pFVar10,0,2);
              _Var11 = ftello64(pFVar10);
              fclose(pFVar10);
              bVar2 = ensure_file_is_writable((char *)&local_838);
              paVar14 = (allocator<char> *)&local_838;
              if (bVar2) {
                local_8d8.m_unbuffered_decompression = SUB41((uint)_uStack_869 >> 8,0);
                local_8d8.m_verify_compressed_data = SUB41((uint)_uStack_869 >> 0x10,0);
                local_8d8.m_force_polar_codes = SUB41((uint)_uStack_869 >> 0x18,0);
                local_8d8.m_comp_level = (undefined4)local_878;
                local_8d8.m_dict_size_log2 = local_878._4_4_;
                local_8d8._8_4_ = SUB74(uStack_870,0);
                local_8d8.m_max_helper_threads = (int)(CONCAT17(uStack_869,uStack_870) >> 0x20);
                local_8d8.m_randomize_params = bVar25;
                local_8d8.m_extreme_parsing = SUB41(local_8a4,0);
                local_8d8.m_deterministic_parsing = SUB41((uint)local_8a4 >> 8,0);
                local_8d8._22_2_ = SUB42((uint)local_8a4 >> 0x10,0);
                if ((bVar25 & 1U) != 0) {
                  uVar6 = rand();
                  local_8d8.m_comp_level = uVar6 % 5;
                  iVar7 = rand();
                  local_8d8.m_dict_size_log2 = iVar7 % 0xf + 0xf;
                  local_8d8.m_max_helper_threads = rand();
                  local_8d8.m_max_helper_threads = local_8d8.m_max_helper_threads % 0x11;
                  iVar7 = rand();
                  local_8d8.m_unbuffered_decompression = (bool)((byte)iVar7 & 1);
                  iVar7 = rand();
                  local_8d8.m_force_polar_codes = (bool)((byte)iVar7 & 1);
                  iVar7 = rand();
                  local_8d8.m_deterministic_parsing = (bool)((byte)iVar7 & 1);
                  comp_options::print(&local_8d8);
                }
                bVar2 = compress_streaming(local_8c0,*(char **)pcVar19,(char *)&local_838,&local_8d8
                                          );
                if (bVar2) {
                  if (local_8d8.m_verify_compressed_data != true) {
LAB_00107e19:
                    pFVar10 = fopen64((char *)&local_838,"rb");
                    if (pFVar10 == (FILE *)0x0) {
                      _Var12 = 0;
                    }
                    else {
                      fseek(pFVar10,0,2);
                      _Var12 = ftello64(pFVar10);
                      fclose(pFVar10);
                    }
                    local_8e0 = (ulong)((int)local_8e0 + 1);
                    local_8b8 = local_8b8 + _Var11;
                    local_8b0 = local_8b0 + _Var12;
                    putchar(10);
                    bVar2 = false;
                    goto LAB_00107e92;
                  }
                  printf("Decompressing file \"%s\" to \"%s\"\n",(allocator<char> *)&local_838,
                         local_438);
                  bVar2 = ensure_file_is_writable((char *)local_438);
                  if (!bVar2) {
                    paVar14 = local_438;
                    goto LAB_00107eef;
                  }
                  options_01.m_verify_compressed_data = local_8d8.m_verify_compressed_data;
                  options_01.m_unbuffered_decompression = local_8d8.m_unbuffered_decompression;
                  options_01.m_force_polar_codes = local_8d8.m_force_polar_codes;
                  options_01.m_randomize_params = local_8d8.m_randomize_params;
                  options_01.m_extreme_parsing = local_8d8.m_extreme_parsing;
                  options_01.m_deterministic_parsing = local_8d8.m_deterministic_parsing;
                  options_01._22_2_ = local_8d8._22_2_;
                  options_01.m_max_helper_threads = local_8d8.m_max_helper_threads;
                  options_01.m_compute_adler32_during_decomp =
                       local_8d8.m_compute_adler32_during_decomp;
                  options_01._9_3_ = local_8d8._9_3_;
                  options_01.m_comp_level = local_8d8.m_comp_level;
                  options_01.m_dict_size_log2 = local_8d8.m_dict_size_log2;
                  bVar2 = decompress_file(local_8c0,(char *)&local_838,(char *)local_438,options_01)
                  ;
                  uVar18 = *(undefined8 *)pcVar19;
                  if (bVar2) {
                    printf("Comparing file \"%s\" to \"%s\"\n",local_438);
                    bVar2 = compare_files((char *)local_438,*(char **)pcVar19);
                    if (bVar2) {
                      puts("Decompressed file compared OK to original file.");
                      goto LAB_00107e19;
                    }
                    uVar18 = *(undefined8 *)pcVar19;
                    pcVar20 = 
                    "Failed comparing decompressed file data while compressing \"%s\" to \"%s\"\n";
                  }
                  else {
                    pcVar20 = "Failed decompressing file \"%s\" to \"%s\"\n";
                    paVar14 = local_438;
                  }
                }
                else {
                  uVar18 = *(undefined8 *)pcVar19;
                  pcVar20 = "Failed compressing file \"%s\" to \"%s\"\n";
                }
                print_error(pcVar20,uVar18,paVar14);
              }
              else {
LAB_00107eef:
                print_error("Unable to create file \"%s\"!\n",paVar14);
              }
              bVar2 = true;
            }
LAB_00107e92:
            if (bVar2) break;
            uVar21 = (ulong)uVar17;
            uVar8 = (long)(local_898._M_string_length - (long)local_898._M_dataplus._M_p) >> 5;
            uVar17 = uVar17 + 1;
            bVar1 = uVar8 <= uVar21;
            _Var24._M_p = local_898._M_dataplus._M_p;
          } while (uVar21 < uVar8);
        }
        if (bVar1) {
          tVar13 = timer::get_ticks();
          timer::ticks_to_secs(tVar13 - local_860);
          uVar8 = local_8e0;
          printf("Test successful: %f secs\n");
          printf("Total files processed: %u\n",uVar8 & 0xffffffff);
          printf("Total source size: %llu\n",local_8b8);
          printf("Total compressed size: %llu\n",local_8b0);
          remove((char *)&local_838);
          remove((char *)local_438);
        }
        uVar17 = (uint)(byte)~bVar1;
      }
      else {
        print_error("Failed finding files under path \"%s\"!\n",pcVar20);
        uVar17 = 1;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_898);
      return uVar17;
    }
    if ((long)uVar8 >> 5 == 0) {
      pcVar20 = "No directory specified!\n";
      goto LAB_0010812d;
    }
LAB_00108126:
    pcVar20 = "Too many filenames!\n";
  }
  else {
    if (iVar7 == 1) {
      if (0x20 < uVar8) {
        if (uVar8 == 0x40) {
          options_00.m_verify_compressed_data = local_8f8.m_verify_compressed_data;
          options_00.m_unbuffered_decompression = local_8f8.m_unbuffered_decompression;
          options_00.m_force_polar_codes = local_8f8.m_force_polar_codes;
          options_00.m_randomize_params = local_8f8.m_randomize_params;
          options_00.m_extreme_parsing = local_8f8.m_extreme_parsing;
          options_00.m_deterministic_parsing = local_8f8.m_deterministic_parsing;
          options_00._22_2_ = local_8f8._22_2_;
          options_00.m_max_helper_threads = local_8f8.m_max_helper_threads;
          options_00.m_compute_adler32_during_decomp = local_8f8.m_compute_adler32_during_decomp;
          options_00._9_3_ = local_8f8._9_3_;
          options_00.m_comp_level = local_8f8.m_comp_level;
          options_00.m_dict_size_log2 = local_8f8.m_dict_size_log2;
          bVar25 = decompress_file(local_8c0,(pbVar23->_M_dataplus)._M_p,pbVar23[1]._M_dataplus._M_p
                                   ,options_00);
          return (uint)!bVar25;
        }
        goto LAB_00108126;
      }
    }
    else if (0x20 < uVar8) {
      if (uVar8 == 0x40) {
        bVar25 = compress_streaming(local_8c0,(pbVar23->_M_dataplus)._M_p,
                                    pbVar23[1]._M_dataplus._M_p,&local_8f8);
        uVar17 = (uint)!bVar25;
        if (!bVar25) {
          return uVar17;
        }
        if (local_8f8.m_verify_compressed_data == true) {
          tVar13 = timer::get_ticks();
          dVar26 = timer::ticks_to_secs(tVar13);
          sprintf((char *)&local_838,"__decomp_temp_%u__.tmp",(long)(dVar26 * 1000.0));
          options_02.m_verify_compressed_data = local_8f8.m_verify_compressed_data;
          options_02.m_unbuffered_decompression = local_8f8.m_unbuffered_decompression;
          options_02.m_force_polar_codes = local_8f8.m_force_polar_codes;
          options_02.m_randomize_params = local_8f8.m_randomize_params;
          options_02.m_extreme_parsing = local_8f8.m_extreme_parsing;
          options_02.m_deterministic_parsing = local_8f8.m_deterministic_parsing;
          options_02._22_2_ = local_8f8._22_2_;
          options_02.m_max_helper_threads = local_8f8.m_max_helper_threads;
          options_02.m_compute_adler32_during_decomp = local_8f8.m_compute_adler32_during_decomp;
          options_02._9_3_ = local_8f8._9_3_;
          options_02.m_comp_level = local_8f8.m_comp_level;
          options_02.m_dict_size_log2 = local_8f8.m_dict_size_log2;
          bVar25 = decompress_file(local_8c0,pbVar23[1]._M_dataplus._M_p,(char *)&local_838,
                                   options_02);
          if (bVar25) {
            printf("Comparing file \"%s\" to \"%s\"\n",&local_838,(pbVar23->_M_dataplus)._M_p);
            bVar25 = compare_files((char *)&local_838,(pbVar23->_M_dataplus)._M_p);
            if (bVar25) {
              puts("Decompressed file compared OK to original file.");
              remove((char *)&local_838);
              return uVar17;
            }
            pcVar19 = (pbVar23->_M_dataplus)._M_p;
            ppuVar15 = (undefined2 **)pbVar23[1]._M_dataplus._M_p;
            pcVar20 = "Failed comparing decompressed file data while compressing \"%s\" to \"%s\"\n"
            ;
          }
          else {
            pcVar19 = pbVar23[1]._M_dataplus._M_p;
            pcVar20 = "Failed decompressing file \"%s\" to \"%s\"\n";
            ppuVar15 = &local_838;
          }
          print_error(pcVar20,pcVar19,ppuVar15);
          return 1;
        }
        return uVar17;
      }
      goto LAB_00108126;
    }
    pcVar20 = "Must specify input and output filenames!\n";
  }
LAB_0010812d:
  print_error(pcVar20);
  return 1;
}

Assistant:

int main_internal(string_array cmd_line, int num_helper_threads, ilzham &lzham_dll)
{
   comp_options options;
   options.m_max_helper_threads = num_helper_threads;

#ifdef _XBOX
   options.m_dict_size_log2 = 21;
#endif

   if (!cmd_line.size())
   {
      print_usage();
      return simple_test(lzham_dll, options);
   }

   enum op_mode_t
   {
      OP_MODE_INVALID = -1,
      OP_MODE_COMPRESS = 0,
      OP_MODE_DECOMPRESS = 1,
      OP_MODE_ALL = 2
   };

   op_mode_t op_mode = OP_MODE_INVALID;

   for (int i = 0; i < (int)cmd_line.size(); i++)
   {
      const std::string &str = cmd_line[i];
      if (str[0] == '-')
      {
         if (str.size() < 2)
         {
            print_error("Invalid option: %s\n", str.c_str());
            return EXIT_FAILURE;
         }
         switch (tolower(str[1]))
         {
            case 'u':
            {
               options.m_unbuffered_decompression = true;
               break;
            }
            case 'd':
            {
               int dict_size = atoi(str.c_str() + 2);
               if ((dict_size < LZHAM_MIN_DICT_SIZE_LOG2) || (dict_size > LZHAMTEST_MAX_POSSIBLE_DICT_SIZE))
               {
                  print_error("Invalid dictionary size: %s\n", str.c_str());
                  return EXIT_FAILURE;
               }
               options.m_dict_size_log2 = dict_size;
               break;
            }
            case 'm':
            {
               int comp_level = atoi(str.c_str() + 2);
               if ((comp_level < 0) || (comp_level > (int)LZHAM_COMP_LEVEL_UBER))
               {
                  print_error("Invalid compression level: %s\n", str.c_str());
                  return EXIT_FAILURE;
               }
               options.m_comp_level = static_cast<lzham_compress_level>(comp_level);
               break;
            }
            case 't':
            {
               int num_threads = atoi(str.c_str() + 2);
               if ((num_threads < 0) || (num_threads > LZHAM_MAX_HELPER_THREADS))
               {
                  print_error("Invalid number of helper threads: %s\n", str.c_str());
                  return EXIT_FAILURE;
               }
               options.m_max_helper_threads = num_threads;
               break;
            }
            case 'c':
            {
               options.m_compute_adler32_during_decomp = false;
               break;
            }
            case 'v':
            {
               options.m_verify_compressed_data = true;
               break;
            }
            case 'r':
            {
               options.m_randomize_params = true;
               break;
            }
            case 'p':
            {
               options.m_force_polar_codes = true;
               break;
            }
            case 'x':
            {
               options.m_extreme_parsing = true;
               break;
            }
            case 'e':
            {
               options.m_deterministic_parsing = true;
               break;
            }
            case 's':
            {
               int seed = atoi(str.c_str() + 2);
               srand(seed);
               printf("Using random seed: %i\n", seed);
               break;
            }
            default:
            {
               print_error("Invalid option: %s\n", str.c_str());
               return EXIT_FAILURE;
            }
         }

         cmd_line.erase(cmd_line.begin() + i);
         i--;

         continue;
      }

      if (str.size() != 1)
      {
         print_error("Invalid mode: %s\n", str.c_str());
         return EXIT_FAILURE;
      }
      switch (tolower(str[0]))
      {
         case 'c':
         {
            op_mode = OP_MODE_COMPRESS;
            break;
         }
         case 'd':
         {
            op_mode = OP_MODE_DECOMPRESS;
            break;
         }
         case 'a':
         {
            op_mode = OP_MODE_ALL;
            break;
         }
         default:
         {
            print_error("Invalid mode: %s\n", str.c_str());
            return EXIT_FAILURE;
         }
      }
      cmd_line.erase(cmd_line.begin() + i);
      break;
   }

   if (op_mode == OP_MODE_INVALID)
   {
      print_error("No mode specified!\n");
      print_usage();
      return EXIT_FAILURE;
   }

   printf("Using options:\n");
   options.print();
   printf("\n");

   int exit_status = EXIT_FAILURE;

   switch (op_mode)
   {
      case OP_MODE_COMPRESS:
      {
         if (cmd_line.size() < 2)
         {
            print_error("Must specify input and output filenames!\n");
            return EXIT_FAILURE;
         }
         else if (cmd_line.size() > 2)
         {
            print_error("Too many filenames!\n");
            return EXIT_FAILURE;
         }

         const std::string &src_file = cmd_line[0];
         const std::string &cmp_file = cmd_line[1];

         bool comp_result = compress_streaming(lzham_dll, src_file.c_str(), cmp_file.c_str(), options);
         if (comp_result)
            exit_status = EXIT_SUCCESS;

         if ((comp_result) && (options.m_verify_compressed_data))
         {
            char decomp_file[256];

#ifdef _XBOX
            sprintf(decomp_file, "e:\\__decomp_temp_%u__.tmp", (uint)GetTickCount());
#else
            sprintf(decomp_file, "__decomp_temp_%u__.tmp", (uint)timer::get_ms());
#endif
            if (!decompress_file(lzham_dll, cmp_file.c_str(), decomp_file, options))
            {
               print_error("Failed decompressing file \"%s\" to \"%s\"\n", cmp_file.c_str(), decomp_file);
               return EXIT_FAILURE;
            }

            printf("Comparing file \"%s\" to \"%s\"\n", decomp_file, src_file.c_str());

            if (!compare_files(decomp_file, src_file.c_str()))
            {
               print_error("Failed comparing decompressed file data while compressing \"%s\" to \"%s\"\n", src_file.c_str(), cmp_file.c_str());
               return EXIT_FAILURE;
            }
            else
            {
               printf("Decompressed file compared OK to original file.\n");
            }

            remove(decomp_file);
         }

         break;
      }
      case OP_MODE_DECOMPRESS:
      {
         if (cmd_line.size() < 2)
         {
            print_error("Must specify input and output filenames!\n");
            return EXIT_FAILURE;
         }
         else if (cmd_line.size() > 2)
         {
            print_error("Too many filenames!\n");
            return EXIT_FAILURE;
         }
         if (decompress_file(lzham_dll, cmd_line[0].c_str(), cmd_line[1].c_str(), options))
            exit_status = EXIT_SUCCESS;
         break;
      }
      case OP_MODE_ALL:
      {
         if (!cmd_line.size())
         {
            print_error("No directory specified!\n");
            return EXIT_FAILURE;
         }
         else if (cmd_line.size() != 1)
         {
            print_error("Too many filenames!\n");
            return EXIT_FAILURE;
         }
         if (test_recursive(lzham_dll, cmd_line[0].c_str(), options))
            exit_status = EXIT_SUCCESS;
         break;
      }
      default:
      {
         print_error("No mode specified!\n");
         print_usage();
         return EXIT_FAILURE;
      }
   }

   return exit_status;
}